

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

ON_Brep * ON_BrepTorus(ON_Torus *torus,ON_Brep *pBrep)

{
  double r;
  ON_RevSurface *pRevSurface;
  ON_Brep *brep;
  ON_Brep *pOStack_18;
  bool bArcLengthParameterization;
  ON_Brep *pBrep_local;
  ON_Torus *torus_local;
  
  brep._7_1_ = 1;
  pRevSurface = (ON_RevSurface *)0x0;
  pOStack_18 = pBrep;
  pBrep_local = (ON_Brep *)torus;
  if (pBrep != (ON_Brep *)0x0) {
    ON_Brep::Destroy(pBrep);
  }
  r = (double)ON_Torus::RevSurfaceForm((ON_Torus *)pBrep_local,(ON_RevSurface *)0x0);
  if ((ON_RevSurface *)r != (ON_RevSurface *)0x0) {
    if ((brep._7_1_ & 1) != 0) {
      (*(((ON_RevSurface *)r)->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
        [0x25])(r,0);
      (**(code **)(*(long *)r + 0x128))(r,1);
    }
    pRevSurface = (ON_RevSurface *)ON_BrepRevSurface((ON_RevSurface **)&r,false,false,pOStack_18);
    if (((ON_Brep *)pRevSurface == (ON_Brep *)0x0) && (r != 0.0)) {
      (**(code **)(*(long *)r + 0x20))();
    }
  }
  return (ON_Brep *)pRevSurface;
}

Assistant:

ON_Brep* ON_BrepTorus( const ON_Torus& torus, ON_Brep* pBrep )
{
  bool bArcLengthParameterization = true;
  ON_Brep* brep = nullptr;
  if ( pBrep )
    pBrep->Destroy();
  ON_RevSurface* pRevSurface = torus.RevSurfaceForm();
  if ( pRevSurface )
  {
    if ( bArcLengthParameterization )
    {
      double r = fabs(torus.major_radius);
      if ( r <= ON_SQRT_EPSILON )
        r = 1.0;
      r *= ON_PI;
      pRevSurface->SetDomain(0,0.0,2.0*r);
      r = fabs(torus.minor_radius);
      if ( r <= ON_SQRT_EPSILON )
        r = 1.0;
      r *= ON_PI;
      pRevSurface->SetDomain(1,0.0,2.0*r);
    }
    brep = ON_BrepRevSurface( pRevSurface, false, false, pBrep );
    if ( !brep )
      delete pRevSurface;
  }
  return brep;
}